

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O0

__pid_t __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::wait(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
       *this,void *__stat_loc)

{
  size_t sVar1;
  bool bVar2;
  __pid_t extraout_EAX;
  size_t sVar3;
  scoped_lock lock;
  pool_type *self;
  recursive_mutex *in_stack_ffffffffffffffa8;
  unique_lock<boost::recursive_mutex> *in_stack_ffffffffffffffb0;
  byte local_35;
  
  unique_lock<boost::recursive_mutex>::unique_lock
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (__stat_loc == (void *)0x0) {
    while( true ) {
      local_35 = 1;
      if (this->m_active_worker_count == 0) {
        bVar2 = fifo_scheduler<boost::function0<void>_>::empty
                          ((fifo_scheduler<boost::function0<void>_> *)0x18a8fd);
        local_35 = bVar2 ^ 0xff;
      }
      if ((local_35 & 1) == 0) break;
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                ((condition_variable_any *)lock._8_8_,(unique_lock<boost::recursive_mutex> *)lock.m)
      ;
    }
  }
  else {
    while (sVar1 = this->m_active_worker_count,
          in_stack_ffffffffffffffb0 = (unique_lock<boost::recursive_mutex> *)__stat_loc,
          sVar3 = fifo_scheduler<boost::function0<void>_>::size
                            ((fifo_scheduler<boost::function0<void>_> *)0x18a975),
          in_stack_ffffffffffffffb0 < (unique_lock<boost::recursive_mutex> *)(sVar1 + sVar3)) {
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                ((condition_variable_any *)lock._8_8_,(unique_lock<boost::recursive_mutex> *)lock.m)
      ;
    }
  }
  unique_lock<boost::recursive_mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  return extraout_EAX;
}

Assistant:

void wait(size_t const task_threshold = 0) const volatile
    {
      const pool_type* self = const_cast<const pool_type*>(this);
      recursive_mutex::scoped_lock lock(self->m_monitor);

      if(0 == task_threshold)
      {
        while(0 != self->m_active_worker_count || !self->m_scheduler.empty())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
      else
      {
        while(task_threshold < self->m_active_worker_count + self->m_scheduler.size())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
    }